

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_file.cpp
# Opt level: O2

void __thiscall
foxxll::linuxaio_file::serve
          (linuxaio_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  request *prVar1;
  undefined1 local_30 [40];
  
  if (op == READ) {
    local_30._24_8_ = 0;
    local_30._32_8_ = (__pthread_internal_list *)0x0;
    local_30._8_8_ = 0;
    local_30._16_8_ = 0;
    aread((linuxaio_file *)local_30,this,(offset_type)buffer,offset,(completion_handler *)bytes);
    prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->
                       ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_30);
    (**(code **)(*(long *)(&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68)) + 0x30))
              (&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68),1);
  }
  else {
    local_30._24_8_ = 0;
    local_30._32_8_ = (__pthread_internal_list *)0x0;
    local_30._8_8_ = 0;
    local_30._16_8_ = 0;
    awrite((linuxaio_file *)local_30,this,(offset_type)buffer,offset,(completion_handler *)bytes);
    prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->
                       ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_30);
    (**(code **)(*(long *)(&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68)) + 0x30))
              (&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68),1);
  }
  tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
            ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 0x20));
  return;
}

Assistant:

void linuxaio_file::serve(void* buffer, offset_type offset, size_type bytes,
                          request::read_or_write op)
{
    // req need not be an linuxaio_request
    if (op == request::READ)
        aread(buffer, offset, bytes)->wait();
    else
        awrite(buffer, offset, bytes)->wait();
}